

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  wchar_t *pwVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  while ((uVar2 = (ulong)(uint)*flags, uVar2 < 0x2d &&
         ((0x100100000200U >> (uVar2 & 0x3f) & 1) != 0))) {
    flags = flags + 1;
  }
  pwVar1 = (wchar_t *)0x0;
  while (pwVar3 = flags, flags = pwVar3, (int)uVar2 != 0) {
    while ((0x2c < (uint)uVar2 || ((0x100100000201U >> (uVar2 & 0x3f) & 1) == 0))) {
      uVar2 = (ulong)(uint)flags[1];
      flags = flags + 1;
    }
    while ((uVar2 = (ulong)(uint)*flags, uVar2 < 0x2d &&
           ((0x100100000200U >> (uVar2 & 0x3f) & 1) != 0))) {
      flags = flags + 1;
    }
    if (pwVar1 == (wchar_t *)0x0) {
      pwVar1 = pwVar3;
    }
  }
  entry->ae_fflags_set = 0;
  entry->ae_fflags_clear = 0;
  return pwVar1;
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}